

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

void __thiscall QAccessibleTabBar::~QAccessibleTabBar(QAccessibleTabBar *this)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&this->super_QAccessibleWidget = &PTR__QAccessibleTabBar_007e0558;
  *(undefined ***)&(this->super_QAccessibleWidget).super_QAccessibleActionInterface =
       &PTR__QAccessibleTabBar_007e0668;
  *(undefined ***)&this->super_QAccessibleSelectionInterface = &PTR__QAccessibleTabBar_007e06b0;
  local_38 = (piter)QHash<int,_unsigned_int>::begin(&this->m_childInterfaces);
  while( true ) {
    if (local_38.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 && local_38.bucket == 0)
    break;
    pSVar1 = (local_38.d)->spans;
    uVar2 = local_38.bucket >> 7;
    QAccessible::deleteAccessibleInterface
              (*(uint *)(pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)local_38.bucket & 0x7f]].
                         storage.data + 4));
    QHashPrivate::iterator<QHashPrivate::Node<int,_unsigned_int>_>::operator++(&local_38);
  }
  QHash<int,_unsigned_int>::~QHash(&this->m_childInterfaces);
  QAccessibleSelectionInterface::~QAccessibleSelectionInterface
            (&this->super_QAccessibleSelectionInterface);
  QAccessibleWidget::~QAccessibleWidget(&this->super_QAccessibleWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleTabBar::~QAccessibleTabBar()
{
    for (QAccessible::Id id : std::as_const(m_childInterfaces))
        QAccessible::deleteAccessibleInterface(id);
}